

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void master_thread_run(mg_context *ctx)

{
  uint uVar1;
  pollfd *pfd_00;
  int iVar2;
  time_t tVar3;
  uint local_3c;
  uint workerthreadcount;
  uint i;
  pollfd *pfd;
  mg_workerTLS tls;
  mg_context *ctx_local;
  
  if (ctx != (mg_context *)0x0) {
    tls.alpn_proto = (char *)ctx;
    mg_set_thread_name("master");
    pfd._0_4_ = 1;
    pthread_setspecific(sTlsKey,&pfd);
    if (*(long *)(tls.alpn_proto + 0x28388) == 0) {
      tls.thread_idx = 0;
    }
    else {
      tls.thread_idx = (**(code **)(tls.alpn_proto + 0x28388))(tls.alpn_proto,0);
    }
    tVar3 = time((time_t *)0x0);
    *(time_t *)(tls.alpn_proto + 0x282e0) = tVar3;
    pfd_00 = *(pollfd **)(tls.alpn_proto + 0x10);
    while (*(int *)(tls.alpn_proto + 0x28) == 0) {
      for (local_3c = 0; local_3c < *(uint *)(tls.alpn_proto + 0x18); local_3c = local_3c + 1) {
        pfd_00[local_3c].fd = *(int *)(*(long *)(tls.alpn_proto + 8) + (ulong)local_3c * 0x40);
        pfd_00[local_3c].events = 1;
      }
      iVar2 = mg_poll(pfd_00,*(uint *)(tls.alpn_proto + 0x18),200,
                      (stop_flag_t *)(tls.alpn_proto + 0x28));
      if (0 < iVar2) {
        for (local_3c = 0; local_3c < *(uint *)(tls.alpn_proto + 0x18); local_3c = local_3c + 1) {
          if ((*(int *)(tls.alpn_proto + 0x28) == 0) && ((pfd_00[local_3c].revents & 1U) != 0)) {
            accept_new_connection
                      ((socket *)(*(long *)(tls.alpn_proto + 8) + (ulong)local_3c * 0x40),
                       (mg_context *)tls.alpn_proto);
          }
        }
      }
    }
    close_all_listening_sockets((mg_context *)tls.alpn_proto);
    pthread_mutex_lock((pthread_mutex_t *)(tls.alpn_proto + 0x30));
    pthread_cond_broadcast((pthread_cond_t *)(tls.alpn_proto + 0x88));
    pthread_mutex_unlock((pthread_mutex_t *)(tls.alpn_proto + 0x30));
    uVar1 = *(uint *)(tls.alpn_proto + 0x60);
    for (local_3c = 0; local_3c < uVar1; local_3c = local_3c + 1) {
      if (*(long *)(*(long *)(tls.alpn_proto + 0x68) + (ulong)local_3c * 8) != 0) {
        mg_join_thread(*(pthread_t *)(*(long *)(tls.alpn_proto + 0x68) + (ulong)local_3c * 8));
      }
    }
    if (*(long *)(tls.alpn_proto + 0x28390) != 0) {
      (**(code **)(tls.alpn_proto + 0x28390))(tls.alpn_proto,0,tls.thread_idx);
    }
    pthread_setspecific(sTlsKey,(void *)0x0);
    tls.alpn_proto[0x28] = '\x02';
    tls.alpn_proto[0x29] = '\0';
    tls.alpn_proto[0x2a] = '\0';
    tls.alpn_proto[0x2b] = '\0';
  }
  return;
}

Assistant:

static void
master_thread_run(struct mg_context *ctx)
{
	struct mg_workerTLS tls;
	struct mg_pollfd *pfd;
	unsigned int i;
	unsigned int workerthreadcount;

	if (!ctx) {
		return;
	}

	mg_set_thread_name("master");

	/* Increase priority of the master thread */
#if defined(_WIN32)
	SetThreadPriority(GetCurrentThread(), THREAD_PRIORITY_ABOVE_NORMAL);
#elif defined(USE_MASTER_THREAD_PRIORITY)
	int min_prio = sched_get_priority_min(SCHED_RR);
	int max_prio = sched_get_priority_max(SCHED_RR);
	if ((min_prio >= 0) && (max_prio >= 0)
	    && ((USE_MASTER_THREAD_PRIORITY) <= max_prio)
	    && ((USE_MASTER_THREAD_PRIORITY) >= min_prio)) {
		struct sched_param sched_param = {0};
		sched_param.sched_priority = (USE_MASTER_THREAD_PRIORITY);
		pthread_setschedparam(pthread_self(), SCHED_RR, &sched_param);
	}
#endif

	/* Initialize thread local storage */
#if defined(_WIN32)
	tls.pthread_cond_helper_mutex = CreateEvent(NULL, FALSE, FALSE, NULL);
#endif
	tls.is_master = 1;
	pthread_setspecific(sTlsKey, &tls);

	if (ctx->callbacks.init_thread) {
		/* Callback for the master thread (type 0) */
		tls.user_ptr = ctx->callbacks.init_thread(ctx, 0);
	} else {
		tls.user_ptr = NULL;
	}

	/* Lua background script "start" event */
#if defined(USE_LUA)
	if (ctx->lua_background_state) {
		lua_State *lstate = (lua_State *)ctx->lua_background_state;
		pthread_mutex_lock(&ctx->lua_bg_mutex);

		/* call "start()" in Lua */
		lua_getglobal(lstate, "start");
		if (lua_type(lstate, -1) == LUA_TFUNCTION) {
			int ret = lua_pcall(lstate, /* args */ 0, /* results */ 0, 0);
			if (ret != 0) {
				struct mg_connection fc;
				lua_cry(fake_connection(&fc, ctx),
				        ret,
				        lstate,
				        "lua_background_script",
				        "start");
			}
		} else {
			lua_pop(lstate, 1);
		}

		/* determine if there is a "log()" function in Lua background script */
		lua_getglobal(lstate, "log");
		if (lua_type(lstate, -1) == LUA_TFUNCTION) {
			ctx->lua_bg_log_available = 1;
		}
		lua_pop(lstate, 1);

		pthread_mutex_unlock(&ctx->lua_bg_mutex);
	}
#endif

	/* Server starts *now* */
	ctx->start_time = time(NULL);

	/* Server accept loop */
	pfd = ctx->listening_socket_fds;
	while (STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		for (i = 0; i < ctx->num_listening_sockets; i++) {
			pfd[i].fd = ctx->listening_sockets[i].sock;
			pfd[i].events = POLLIN;
		}

		if (mg_poll(pfd,
		            ctx->num_listening_sockets,
		            SOCKET_TIMEOUT_QUANTUM,
		            &(ctx->stop_flag))
		    > 0) {
			for (i = 0; i < ctx->num_listening_sockets; i++) {
				/* NOTE(lsm): on QNX, poll() returns POLLRDNORM after the
				 * successful poll, and POLLIN is defined as
				 * (POLLRDNORM | POLLRDBAND)
				 * Therefore, we're checking pfd[i].revents & POLLIN, not
				 * pfd[i].revents == POLLIN. */
				if (STOP_FLAG_IS_ZERO(&ctx->stop_flag)
				    && (pfd[i].revents & POLLIN)) {
					accept_new_connection(&ctx->listening_sockets[i], ctx);
				}
			}
		}
	}

	/* Here stop_flag is 1 - Initiate shutdown. */
	DEBUG_TRACE("%s", "stopping workers");

	/* Stop signal received: somebody called mg_stop. Quit. */
	close_all_listening_sockets(ctx);

	/* Wakeup workers that are waiting for connections to handle. */
#if defined(ALTERNATIVE_QUEUE)
	for (i = 0; i < ctx->cfg_worker_threads; i++) {
		event_signal(ctx->client_wait_events[i]);
	}
#else
	(void)pthread_mutex_lock(&ctx->thread_mutex);
	pthread_cond_broadcast(&ctx->sq_full);
	(void)pthread_mutex_unlock(&ctx->thread_mutex);
#endif

	/* Join all worker threads to avoid leaking threads. */
	workerthreadcount = ctx->cfg_worker_threads;
	for (i = 0; i < workerthreadcount; i++) {
		if (ctx->worker_threadids[i] != 0) {
			mg_join_thread(ctx->worker_threadids[i]);
		}
	}

#if defined(USE_LUA)
	/* Free Lua state of lua background task */
	if (ctx->lua_background_state) {
		lua_State *lstate = (lua_State *)ctx->lua_background_state;
		ctx->lua_bg_log_available = 0;

		/* call "stop()" in Lua */
		pthread_mutex_lock(&ctx->lua_bg_mutex);
		lua_getglobal(lstate, "stop");
		if (lua_type(lstate, -1) == LUA_TFUNCTION) {
			int ret = lua_pcall(lstate, /* args */ 0, /* results */ 0, 0);
			if (ret != 0) {
				struct mg_connection fc;
				lua_cry(fake_connection(&fc, ctx),
				        ret,
				        lstate,
				        "lua_background_script",
				        "stop");
			}
		}
		DEBUG_TRACE("Close Lua background state %p", lstate);
		lua_close(lstate);

		ctx->lua_background_state = 0;
		pthread_mutex_unlock(&ctx->lua_bg_mutex);
	}
#endif

	DEBUG_TRACE("%s", "exiting");

	/* call exit thread callback */
	if (ctx->callbacks.exit_thread) {
		/* Callback for the master thread (type 0) */
		ctx->callbacks.exit_thread(ctx, 0, tls.user_ptr);
	}

#if defined(_WIN32)
	CloseHandle(tls.pthread_cond_helper_mutex);
#endif
	pthread_setspecific(sTlsKey, NULL);

	/* Signal mg_stop() that we're done.
	 * WARNING: This must be the very last thing this
	 * thread does, as ctx becomes invalid after this line. */
	STOP_FLAG_ASSIGN(&ctx->stop_flag, 2);
}